

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.cpp
# Opt level: O0

int NULLCMemory::compare(NULLCArray lhs,int lhsOffset,NULLCArray rhs,int rhsOffset,int size)

{
  bool bVar1;
  int elements;
  NULLCArray buffer;
  NULLCArray buffer_00;
  int rhsOffset_local;
  int lhsOffset_local;
  NULLCArray rhs_local;
  NULLCArray lhs_local;
  
  buffer.ptr = (char *)(ulong)lhs.len;
  buffer.len = lhsOffset;
  elements = rhsOffset;
  bVar1 = check_access((NULLCMemory *)lhs.ptr,buffer,0,size,rhsOffset);
  if (bVar1) {
    buffer_00.ptr = (char *)(ulong)rhs.len;
    buffer_00.len = rhsOffset;
    bVar1 = check_access((NULLCMemory *)rhs.ptr,buffer_00,0,size,elements);
    if (bVar1) {
      lhs_local.ptr._4_4_ =
           memcmp((NULLCMemory *)lhs.ptr + lhsOffset,(NULLCMemory *)rhs.ptr + rhsOffset,(long)size);
    }
    else {
      lhs_local.ptr._4_4_ = 0;
    }
  }
  else {
    lhs_local.ptr._4_4_ = 0;
  }
  return lhs_local.ptr._4_4_;
}

Assistant:

int compare(NULLCArray lhs, int lhsOffset, NULLCArray rhs, int rhsOffset, int size)
	{
		if(!check_access(lhs, lhsOffset, 0, size))
			return 0;

		if(!check_access(rhs, rhsOffset, 0, size))
			return 0;

		return memcmp(lhs.ptr + lhsOffset, rhs.ptr + rhsOffset, size);
	}